

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message.cpp
# Opt level: O0

void test_cntranslate(string *c,string *s,string *p,int n,string *expected,locale *l,string *domain)

{
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string *in_R8;
  string *in_stack_00000008;
  locale *in_stack_00000d68;
  string *in_stack_00000d70;
  int in_stack_00000d7c;
  string *in_stack_00000d80;
  string *in_stack_00000d88;
  string *in_stack_00000d90;
  string *in_stack_00000da0;
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [48];
  string local_70 [32];
  string local_50 [80];
  
  std::__cxx11::string::string(local_50,in_RDI);
  std::__cxx11::string::string(local_70,in_RSI);
  std::__cxx11::string::string(local_a0,in_RDX);
  std::__cxx11::string::string(local_c0,in_R8);
  std::__cxx11::string::string(local_e0,in_stack_00000008);
  strings_equal<char>(in_stack_00000d90,in_stack_00000d88,in_stack_00000d80,in_stack_00000d7c,
                      in_stack_00000d70,in_stack_00000d68,in_stack_00000da0);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string(local_100,in_RDI);
  std::__cxx11::string::string(local_120,in_RSI);
  std::__cxx11::string::string(local_140,in_RDX);
  std::__cxx11::string::string(local_160,in_R8);
  std::__cxx11::string::string(local_180,in_stack_00000008);
  strings_equal<wchar_t>
            (in_stack_00000d90,in_stack_00000d88,in_stack_00000d80,in_stack_00000d7c,
             in_stack_00000d70,in_stack_00000d68,in_stack_00000da0);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_100);
  return;
}

Assistant:

void test_cntranslate(std::string c,std::string s,std::string p,int n,std::string expected,std::locale const &l,std::string domain)
{
    strings_equal<char>(c,s,p,n,expected,l,domain);
    strings_equal<wchar_t>(c,s,p,n,expected,l,domain);
    #ifdef BOOSTER_HAS_CHAR16_T
    if(backend=="icu" || backend=="std")
        strings_equal<char16_t>(c,s,p,n,expected,l,domain);
    #endif
    #ifdef BOOSTER_HAS_CHAR32_T
    if(backend=="icu" || backend=="std")
        strings_equal<char32_t>(c,s,p,n,expected,l,domain);
    #endif
}